

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utext_openReplaceable_63(UText *ut,Replaceable *rep,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UErrorCode *status_local;
  Replaceable *rep_local;
  UText *ut_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (rep == (Replaceable *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local = (UText *)0x0;
    }
    else {
      ut_local = utext_setup_63(ut,0x16,status);
      UVar1 = U_FAILURE(*status);
      if (UVar1 == '\0') {
        ut_local->providerProperties = 8;
        iVar2 = (*(rep->super_UObject)._vptr_UObject[6])();
        if ((char)iVar2 != '\0') {
          ut_local->providerProperties = ut_local->providerProperties | 0x10;
        }
        ut_local->pFuncs = &repFuncs;
        ut_local->context = rep;
      }
    }
  }
  else {
    ut_local = (UText *)0x0;
  }
  return ut_local;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_openReplaceable(UText *ut, Replaceable *rep, UErrorCode *status)
{
    if(U_FAILURE(*status)) {
        return NULL;
    }
    if(rep==NULL) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    ut = utext_setup(ut, sizeof(ReplExtra), status);
    if(U_FAILURE(*status)) {
        return ut;
    }

    ut->providerProperties = I32_FLAG(UTEXT_PROVIDER_WRITABLE);
    if(rep->hasMetaData()) {
        ut->providerProperties |=I32_FLAG(UTEXT_PROVIDER_HAS_META_DATA);
    }

    ut->pFuncs  = &repFuncs;
    ut->context =  rep;
    return ut;
}